

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O2

void Fra_FraigInductionRewrite(Fra_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  uint __line;
  abctime aVar3;
  Aig_Man_t *pAVar4;
  void *pvVar5;
  void *pvVar6;
  Aig_Man_t *pAVar7;
  abctime aVar8;
  int i;
  char *__assertion;
  int iVar9;
  int iVar10;
  
  aVar3 = Abc_Clock();
  pAVar4 = Dar_ManRewriteDefault(p->pManFraig);
  if (p->pManFraig->nRegs == pAVar4->nRegs) {
    if (p->pManFraig->nAsserts == pAVar4->nAsserts) {
      iVar9 = p->pManAig->nObjs[2];
      iVar1 = p->pManAig->nRegs;
      i = 0;
      memset(p->pMemFraig,0,(long)p->nFramesAll * (long)p->nSizeAlloc * 8);
      pAVar2 = p->pManAig->pConst1;
      pvVar5 = (pAVar2->field_5).pData;
      *(Aig_Obj_t **)
       (*(long *)((long)pvVar5 + 0x20) +
       ((long)pAVar2->Id * (long)*(int *)((long)pvVar5 + 0x18) + (long)p->pPars->nFramesK) * 8) =
           pAVar4->pConst1;
      while( true ) {
        pAVar7 = p->pManAig;
        iVar10 = pAVar7->nObjs[2] - pAVar7->nRegs;
        if (iVar10 <= i) break;
        pvVar5 = Vec_PtrEntry(pAVar7->vCis,i);
        iVar10 = p->pPars->nFramesK;
        pvVar6 = Vec_PtrEntry(pAVar4->vCis,iVar10 * (iVar9 - iVar1) + i);
        *(void **)(*(long *)(*(long *)((long)pvVar5 + 0x28) + 0x20) +
                  (long)(*(int *)((long)pvVar5 + 0x24) *
                         *(int *)(*(long *)((long)pvVar5 + 0x28) + 0x18) + iVar10) * 8) = pvVar6;
        i = i + 1;
      }
      if (pAVar7->nRegs == pAVar4->nObjs[3] - pAVar4->nAsserts) {
        iVar9 = 0;
        while( true ) {
          iVar1 = iVar10 + iVar9;
          if (pAVar7->vCis->nSize <= iVar1) break;
          pvVar5 = Vec_PtrEntry(pAVar7->vCis,iVar1);
          pvVar6 = Vec_PtrEntry(pAVar4->vCos,iVar9 + pAVar4->nAsserts);
          *(undefined8 *)
           (*(long *)(*(long *)((long)pvVar5 + 0x28) + 0x20) +
           ((long)*(int *)((long)pvVar5 + 0x24) *
            (long)*(int *)(*(long *)((long)pvVar5 + 0x28) + 0x18) + (long)p->pPars->nFramesK) * 8) =
               *(undefined8 *)((long)pvVar6 + 8);
          pAVar7 = p->pManAig;
          iVar9 = iVar9 + 1;
        }
        Aig_ManStop(p->pManFraig);
        p->pManFraig = pAVar4;
        aVar8 = Abc_Clock();
        p->timeRwr = p->timeRwr + (aVar8 - aVar3);
        return;
      }
      __assertion = "Aig_ManRegNum(p->pManAig) == Aig_ManCoNum(pTemp) - pTemp->nAsserts";
      __line = 0x47;
    }
    else {
      __assertion = "p->pManFraig->nAsserts == pTemp->nAsserts";
      __line = 0x40;
    }
  }
  else {
    __assertion = "p->pManFraig->nRegs == pTemp->nRegs";
    __line = 0x3f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                ,__line,"void Fra_FraigInductionRewrite(Fra_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs AIG rewriting on the constraint manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fra_FraigInductionRewrite( Fra_Man_t * p )
{
    Aig_Man_t * pTemp;
    Aig_Obj_t * pObj, * pObjPo;
    int nTruePis, k, i;
    abctime clk = Abc_Clock();
    // perform AIG rewriting on the speculated frames
//    pTemp = Dar_ManRwsat( pTemp, 1, 0 );
    pTemp = Dar_ManRewriteDefault( p->pManFraig );
//    printf( "Before = %6d.  After = %6d.\n", Aig_ManNodeNum(p->pManFraig), Aig_ManNodeNum(pTemp) ); 
//Aig_ManDumpBlif( p->pManFraig, "1.blif", NULL, NULL );
//Aig_ManDumpBlif( pTemp, "2.blif", NULL, NULL );
//    Fra_FramesWriteCone( pTemp );
//    Aig_ManStop( pTemp );
    // transfer PI/register pointers
    assert( p->pManFraig->nRegs == pTemp->nRegs );
    assert( p->pManFraig->nAsserts == pTemp->nAsserts );
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
    Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), p->pPars->nFramesK, Aig_ManConst1(pTemp) );
    Aig_ManForEachPiSeq( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, Aig_ManCi(pTemp,nTruePis*p->pPars->nFramesK+i) );
    k = 0;
    assert( Aig_ManRegNum(p->pManAig) == Aig_ManCoNum(pTemp) - pTemp->nAsserts );
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        pObjPo = Aig_ManCo(pTemp, pTemp->nAsserts + k++);
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, Aig_ObjChild0(pObjPo) );
    }
    // exchange
    Aig_ManStop( p->pManFraig );
    p->pManFraig = pTemp;
p->timeRwr += Abc_Clock() - clk;
}